

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localization_backend.cpp
# Opt level: O0

locale __thiscall
booster::locale::localization_backend_manager::impl::actual_backend::install
          (actual_backend *this,locale *l,locale_category_type category,character_facet_type type)

{
  size_type sVar1;
  reference pvVar2;
  element_type *peVar3;
  uint in_ECX;
  locale *in_RDX;
  long in_RSI;
  _Impl *in_RDI;
  uint in_R8D;
  uint v;
  int id;
  uint local_28;
  uint local_24;
  
  local_24 = 0;
  for (local_28 = 1; (local_28 != 0 && (in_ECX != local_28)); local_28 = local_28 << 1) {
    local_24 = local_24 + 1;
  }
  if (local_28 == 0) {
    std::locale::locale((locale *)in_RDI,in_RDX);
  }
  else {
    sVar1 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x20));
    if (local_24 < sVar1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x20),(long)(int)local_24);
      if (*pvVar2 == -1) {
        std::locale::locale((locale *)in_RDI,in_RDX);
      }
      else {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x20),(long)(int)local_24
                           );
        std::
        vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
        ::operator[]((vector<std::shared_ptr<booster::locale::localization_backend>,_std::allocator<std::shared_ptr<booster::locale::localization_backend>_>_>
                      *)(in_RSI + 8),(long)*pvVar2);
        peVar3 = std::
                 __shared_ptr_access<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x23da1c);
        (*peVar3->_vptr_localization_backend[5])(in_RDI,peVar3,in_RDX,(ulong)in_ECX,(ulong)in_R8D);
      }
    }
    else {
      std::locale::locale((locale *)in_RDI,in_RDX);
    }
  }
  return (locale)in_RDI;
}

Assistant:

virtual std::locale install(std::locale const &l,locale_category_type category,character_facet_type type = nochar_facet)
                {
                    int id;
                    unsigned v;
                    for(v=1,id=0;v!=0;v<<=1,id++) {
                        if(category == v)
                            break;
                    }
                    if(v==0)
                        return l;
                    if(unsigned(id) >= index_.size())
                        return l;
                    if(index_[id]==-1) 
                        return l;
                    return backends_[index_[id]]->install(l,category,type);
                }